

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall dxil_spv::CFGNode::retarget_branch(CFGNode *this,CFGNode *to_prev,CFGNode *to_next)

{
  CFGNode *this_00;
  
  retarget_branch_pre_traversal(this,to_prev,to_next);
  this_00 = to_prev;
  if (to_next->forward_post_visit_order < to_prev->forward_post_visit_order) {
    this_00 = to_next;
    to_next = to_prev;
  }
  recompute_immediate_dominator(to_next);
  recompute_immediate_dominator(this_00);
  recompute_immediate_post_dominator(this);
  return;
}

Assistant:

void CFGNode::retarget_branch(CFGNode *to_prev, CFGNode *to_next)
{
	retarget_branch_pre_traversal(to_prev, to_next);

	// Branch targets have changed, so recompute immediate dominators.
	if (to_prev->forward_post_visit_order > to_next->forward_post_visit_order)
	{
		to_prev->recompute_immediate_dominator();
		to_next->recompute_immediate_dominator();
	}
	else
	{
		to_next->recompute_immediate_dominator();
		to_prev->recompute_immediate_dominator();
	}

	// ... and post dominator for ourself.
	// I am not sure if it's technically possible that we have to recompute the entire post domination graph now?
	recompute_immediate_post_dominator();
}